

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

int __thiscall BoardView::ConfigParse(BoardView *this)

{
  Confparse *obvconfig;
  bool bVar1;
  ImGuiStyle *pIVar2;
  
  pIVar2 = ImGui::GetStyle();
  obvconfig = &this->obvconfig;
  Config::readFromConfig(&this->config,obvconfig);
  setDPI((this->config).dpi);
  bVar1 = (bool)((this->config).slowCPU ^ 1);
  pIVar2->AntiAliasedLines = bVar1;
  pIVar2->AntiAliasedFill = bVar1;
  (this->m_info_surface).x = (float)(this->config).infoPanelWidth;
  (this->backgroundImage).enabled = (this->config).showBackgroundImage;
  ColorScheme::readFromConfig(&this->m_colors,obvconfig);
  KeyBindings::readFromConfig(&this->keybindings,obvconfig);
  return 0;
}

Assistant:

int BoardView::ConfigParse(void) {
	ImGuiStyle &style = ImGui::GetStyle();

	config.readFromConfig(obvconfig);

	setDPI(config.dpi);

	style.AntiAliasedLines = !config.slowCPU;
	style.AntiAliasedFill  = !config.slowCPU;

	m_info_surface.x = config.infoPanelWidth;
	backgroundImage.enabled = config.showBackgroundImage;

	m_colors.readFromConfig(obvconfig);
	keybindings.readFromConfig(obvconfig);

	return 0;
}